

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O1

void __thiscall Sequence::Sequence(Sequence *this,int t_size)

{
  deque<int,_std::allocator<int>_> *this_00;
  result_type *prVar1;
  uint uVar2;
  result_type rVar3;
  long lVar4;
  ulong uVar5;
  result_type *prVar6;
  _Map_pointer ppiVar7;
  result_type *prVar8;
  anon_class_5008_2_615ce6dd wrapped;
  allocator_type local_2759;
  deque<int,_std::allocator<int>_> *local_2758;
  undefined1 local_2750 [5008];
  ulong local_13c0 [625];
  undefined8 local_38;
  
  this->_vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  this_00 = &this->m_bits;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map
       = (_Map_pointer)0x0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            (&this_00->super__Deque_base<int,_std::allocator<int>_>,0);
  local_2758 = this_00;
  std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)local_2750,(long)t_size,&local_2759);
  std::deque<int,_std::allocator<int>_>::_M_move_assign1
            (this_00,(_Deque_base<int,_std::allocator<int>_> *)local_2750);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_2750);
  local_13c0[0] = 0x100000000;
  std::random_device::random_device((random_device *)local_2750);
  uVar2 = std::random_device::_M_getval();
  local_13c0[1] = (ulong)uVar2;
  lVar4 = 2;
  uVar5 = local_13c0[1];
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4) - 1);
    local_13c0[lVar4] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x271);
  local_38 = 0x270;
  std::random_device::_M_fini();
  memcpy(local_2750,local_13c0,0x1390);
  prVar8 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  prVar1 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (prVar8 != prVar1) {
    prVar6 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppiVar7 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    do {
      rVar3 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)local_2750,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)(local_2750 + 8),(param_type *)local_2750);
      *prVar8 = rVar3;
      prVar8 = prVar8 + 1;
      if (prVar8 == prVar6) {
        prVar8 = ppiVar7[1];
        ppiVar7 = ppiVar7 + 1;
        prVar6 = prVar8 + 0x80;
      }
    } while (prVar8 != prVar1);
  }
  return;
}

Assistant:

Sequence::Sequence(int t_size) {
    m_bits = std::deque<int>(t_size);

    // Lambda function to generate random bits
    auto rand_between = [](int low, int high) {
        auto wrapped = [distribution_ = std::uniform_int_distribution<int>(low, high),
                        random_engine_ = std::mt19937{std::random_device{}()}]() mutable {
            return distribution_(random_engine_);
        };
        return wrapped;
    };

    std::ranges::generate(m_bits, rand_between(0, 1));
}